

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_bonsai_trie.hpp
# Opt level: O2

void __thiscall
poplar::
compact_bonsai_trie<95U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
::show_stats(compact_bonsai_trie<95U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
             *this,ostream *os,int n)

{
  int n_00;
  undefined1 auVar1 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar2 [16];
  undefined1 in_ZMM1 [64];
  string indent;
  double local_48;
  string local_40;
  
  auVar2 = in_ZMM1._0_16_;
  auVar1 = in_ZMM0._0_16_;
  get_indent_abi_cxx11_(&local_40,(poplar *)(ulong)(uint)n,n);
  show_stat<char[18]>(os,&local_40,"name",(char (*) [18])"compact_hash_trie");
  auVar1 = vcvtusi2sd_avx512f(auVar1,this->size_);
  auVar2 = vcvtusi2sd_avx512f(auVar2,(this->capa_size_).mask_ + 1);
  local_48 = (auVar1._0_8_ / auVar2._0_8_) * 100.0;
  show_stat<double>(os,&local_40,"factor",&local_48);
  local_48 = (double)CONCAT44(local_48._4_4_,0x5f);
  show_stat<unsigned_int>(os,&local_40,"max_factor",(uint *)&local_48);
  local_48 = (double)this->size_;
  show_stat<unsigned_long>(os,&local_40,"size",(unsigned_long *)&local_48);
  local_48 = (double)alloc_bytes(this);
  show_stat<unsigned_long>(os,&local_40,"alloc_bytes",(unsigned_long *)&local_48);
  local_48._0_4_ = (this->capa_size_).bits_;
  show_stat<unsigned_int>(os,&local_40,"capa_bits",(uint *)&local_48);
  local_48 = (double)CONCAT44(local_48._4_4_,(this->symb_size_).bits_);
  show_stat<unsigned_int>(os,&local_40,"symb_bits",(uint *)&local_48);
  show_stat<unsigned_int>(os,&local_40,"dsp1st_bits",&dsp1_bits);
  show_stat<unsigned_int>(os,&local_40,"dsp2nd_bits",&dsp2_bits);
  show_member(os,&local_40,"hasher_");
  n_00 = n + 1;
  bijective_hash::split_mix_hasher::show_stats(&this->hasher_,os,n_00);
  show_member(os,&local_40,"aux_cht_");
  compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>::show_stats
            (&this->aux_cht_,os,n_00);
  show_member(os,&local_40,"aux_map_");
  standard_hash_table<80U,_poplar::hash::vigna_hasher>::show_stats(&this->aux_map_,os,n_00);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void show_stats(std::ostream& os, int n = 0) const {
        auto indent = get_indent(n);
        show_stat(os, indent, "name", "compact_hash_trie");
        show_stat(os, indent, "factor", double(size()) / capa_size() * 100);
        show_stat(os, indent, "max_factor", MaxFactor);
        show_stat(os, indent, "size", size());
        show_stat(os, indent, "alloc_bytes", alloc_bytes());
        show_stat(os, indent, "capa_bits", capa_bits());
        show_stat(os, indent, "symb_bits", symb_bits());
        show_stat(os, indent, "dsp1st_bits", dsp1_bits);
        show_stat(os, indent, "dsp2nd_bits", dsp2_bits);
#ifdef POPLAR_EXTRA_STATS
        show_stat(os, indent, "rate_dsp1st", double(num_dsps_[0]) / size());
        show_stat(os, indent, "rate_dsp2nd", double(num_dsps_[1]) / size());
        show_stat(os, indent, "rate_dsp3rd", double(num_dsps_[2]) / size());
        show_stat(os, indent, "num_resize", num_resize_);
#endif
        show_member(os, indent, "hasher_");
        hasher_.show_stats(os, n + 1);
        show_member(os, indent, "aux_cht_");
        aux_cht_.show_stats(os, n + 1);
        show_member(os, indent, "aux_map_");
        aux_map_.show_stats(os, n + 1);
    }